

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_1,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *y,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  undefined4 *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  pointer pnVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  byte bVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int32_t iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  cpp_dec_float<100U,_int,_void> *pcVar26;
  VarStatus *pVVar27;
  VarStatus VVar28;
  long lVar29;
  VarStatus *pVVar30;
  cpp_dec_float<100U,_int,_void> *pcVar31;
  cpp_dec_float<100U,_int,_void> *pcVar32;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar33;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar34;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<100U,_int,_void> local_d8;
  undefined1 local_88 [88];
  
  if ((this->m_isLast == true) && (lVar24 = (long)(this->m_perm).thesize, 0 < lVar24)) {
    uVar25 = lVar24 + 1;
    lVar24 = lVar24 * 0x14 + -2;
    do {
      lVar29 = (long)(this->m_perm).data[uVar25 - 2];
      if (-1 < lVar29) {
        pnVar4 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = *(undefined8 *)&pnVar4[lVar29].m_backend.data;
        uVar15 = *(undefined8 *)((long)&pnVar4[lVar29].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar4[lVar29].m_backend.data + 0x10);
        uVar16 = *(undefined8 *)puVar2;
        uVar17 = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&pnVar4[lVar29].m_backend.data + 0x20);
        uVar18 = *(undefined8 *)puVar2;
        uVar19 = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&pnVar4[lVar29].m_backend.data + 0x30);
        uVar20 = *(undefined8 *)(puVar2 + 2);
        puVar3 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar24 * 4 + -0x18);
        *puVar3 = *(undefined8 *)puVar2;
        puVar3[1] = uVar20;
        puVar3 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar24 * 4 + -0x28);
        *puVar3 = uVar18;
        puVar3[1] = uVar19;
        puVar3 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar24 * 4 + -0x38);
        *puVar3 = uVar16;
        puVar3[1] = uVar17;
        puVar3 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar24 * 4 + -0x48);
        *puVar3 = uVar7;
        puVar3[1] = uVar15;
        *(int *)((long)&(pnVar4->m_backend).data + lVar24 * 4 + -8) = pnVar4[lVar29].m_backend.exp;
        *(bool *)((long)&(pnVar4->m_backend).data + lVar24 * 4 + -4) = pnVar4[lVar29].m_backend.neg;
        *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar24 * 4) =
             *(undefined8 *)&pnVar4[lVar29].m_backend.fpclass;
        pnVar5 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar4 = pnVar5 + lVar29;
        uVar10 = (pnVar4->m_backend).data._M_elems[0];
        uVar11 = *(uint *)((long)&(pnVar4->m_backend).data + 4);
        uVar12 = *(uint *)((long)&(pnVar4->m_backend).data + 8);
        uVar13 = *(uint *)((long)&(pnVar4->m_backend).data + 0xc);
        puVar2 = (uint *)((long)&pnVar5[lVar29].m_backend.data + 0x10);
        uVar7 = *(undefined8 *)puVar2;
        uVar15 = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&pnVar5[lVar29].m_backend.data + 0x20);
        uVar16 = *(undefined8 *)puVar2;
        uVar17 = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)&pnVar5[lVar29].m_backend.data + 0x30);
        uVar18 = *(undefined8 *)(puVar2 + 2);
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -0x18);
        *puVar3 = *(undefined8 *)puVar2;
        puVar3[1] = uVar18;
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -0x28);
        *puVar3 = uVar16;
        puVar3[1] = uVar17;
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -0x38);
        *puVar3 = uVar7;
        puVar3[1] = uVar15;
        puVar1 = (undefined4 *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -0x48);
        *puVar1 = uVar10;
        puVar1[1] = uVar11;
        puVar1[2] = uVar12;
        puVar1[3] = uVar13;
        *(int *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -8) = pnVar5[lVar29].m_backend.exp;
        *(bool *)((long)&(pnVar5->m_backend).data + lVar24 * 4 + -4) = pnVar5[lVar29].m_backend.neg;
        *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar24 * 4) =
             *(undefined8 *)&pnVar5[lVar29].m_backend.fpclass;
        rStatus->data[uVar25 - 2] = rStatus->data[lVar29];
      }
      uVar25 = uVar25 - 1;
      lVar24 = lVar24 + -0x14;
    } while (1 < uVar25);
  }
  iVar22 = (this->m_scale).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar22) {
    lVar29 = 0;
    lVar24 = 0;
    do {
      pNVar6 = (this->m_scale).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar6->val + 1) + lVar29) != this->m_i) {
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 0x10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems[6] = 0;
        local_d8.data._M_elems[7] = 0;
        local_d8.data._M_elems[8] = 0;
        local_d8.data._M_elems[9] = 0;
        local_d8.data._M_elems[10] = 0;
        local_d8.data._M_elems[0xb] = 0;
        local_d8.data._M_elems[0xc] = 0;
        local_d8.data._M_elems[0xd] = 0;
        local_d8.data._M_elems._56_5_ = 0;
        local_d8.data._M_elems[0xf]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_d8,
                   &(s->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)(pNVar6->val).m_backend.data._M_elems + lVar29));
        iVar22 = *(int *)((long)(&((this->m_scale).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val + 1) + lVar29);
        pnVar5 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (uint *)((long)&pnVar5[iVar22].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = local_d8.data._M_elems._48_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
        puVar2 = (uint *)((long)&pnVar5[iVar22].m_backend.data + 0x20);
        *(undefined8 *)puVar2 = local_d8.data._M_elems._32_8_;
        *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._40_8_;
        puVar2 = (uint *)((long)&pnVar5[iVar22].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_d8.data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._24_8_;
        pnVar4 = pnVar5 + iVar22;
        (pnVar4->m_backend).data._M_elems[0] = local_d8.data._M_elems[0];
        *(uint *)((long)&(pnVar4->m_backend).data + 4) = local_d8.data._M_elems[1];
        *(uint *)((long)&(pnVar4->m_backend).data + 8) = local_d8.data._M_elems[2];
        *(uint *)((long)&(pnVar4->m_backend).data + 0xc) = local_d8.data._M_elems[3];
        pnVar5[iVar22].m_backend.exp = local_d8.exp;
        pnVar5[iVar22].m_backend.neg = local_d8.neg;
        pnVar5[iVar22].m_backend.fpclass = local_d8.fpclass;
        pnVar5[iVar22].m_backend.prec_elem = local_d8.prec_elem;
        iVar22 = (this->m_scale).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar24 = lVar24 + 1;
      lVar29 = lVar29 + 0x54;
    } while (lVar24 < iVar22);
    if (0 < iVar22) {
      pnVar34 = &this->m_i_rowObj;
      pVVar27 = rStatus->data;
      lVar24 = 0;
      lVar29 = 0;
      bVar9 = 0;
      local_88._80_8_ = pnVar34;
      do {
        pNVar6 = (this->m_scale).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        iVar22 = *(int *)((long)(&pNVar6->val + 1) + lVar24);
        iVar23 = this->m_i;
        VVar28 = pVVar27[iVar23];
        if ((VVar28 == BASIC) || ((bool)(iVar22 != iVar23 & bVar9))) {
LAB_0043e239:
          pNVar6 = (this->m_rowObj).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined4 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar24);
          uVar10 = *puVar1;
          uVar11 = puVar1[1];
          uVar12 = puVar1[2];
          uVar13 = puVar1[3];
          puVar3 = (undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar24 + 0x10);
          uVar7 = *puVar3;
          uVar15 = puVar3[1];
          puVar3 = (undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar24 + 0x20);
          uVar16 = *puVar3;
          uVar17 = puVar3[1];
          puVar3 = (undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar24 + 0x30);
          uVar18 = puVar3[1];
          puVar2 = (uint *)((long)&pnVar5[iVar22].m_backend.data + 0x30);
          *(undefined8 *)puVar2 = *puVar3;
          *(undefined8 *)(puVar2 + 2) = uVar18;
          puVar2 = (uint *)((long)&pnVar5[iVar22].m_backend.data + 0x20);
          *(undefined8 *)puVar2 = uVar16;
          *(undefined8 *)(puVar2 + 2) = uVar17;
          puVar2 = (uint *)((long)&pnVar5[iVar22].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = uVar7;
          *(undefined8 *)(puVar2 + 2) = uVar15;
          pnVar4 = pnVar5 + iVar22;
          (pnVar4->m_backend).data._M_elems[0] = uVar10;
          *(uint *)((long)&(pnVar4->m_backend).data + 4) = uVar11;
          *(uint *)((long)&(pnVar4->m_backend).data + 8) = uVar12;
          *(uint *)((long)&(pnVar4->m_backend).data + 0xc) = uVar13;
          pnVar5[iVar22].m_backend.exp =
               *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar24);
          pnVar5[iVar22].m_backend.neg =
               *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar24 + 4);
          uVar7 = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar24 + 8);
          pnVar5[iVar22].m_backend.fpclass = (int)uVar7;
          pnVar5[iVar22].m_backend.prec_elem = (int)((ulong)uVar7 >> 0x20);
          pVVar27 = rStatus->data;
          pVVar30 = pVVar27 + iVar22;
LAB_0043e2a6:
          *pVVar30 = BASIC;
        }
        else if (VVar28 == FIXED) {
          if ((iVar22 == this->m_maxLhsIdx) || (iVar22 == this->m_minRhsIdx)) {
            pcVar26 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend;
            pcVar31 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)(pNVar6->val).m_backend.data._M_elems + lVar24);
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            pcVar32 = pcVar26;
            if ((pcVar31 != &local_d8) && (pcVar32 = pcVar31, &local_d8 != pcVar26)) {
              local_d8.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems;
              local_d8.data._M_elems._8_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 2);
              local_d8.data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 4);
              local_d8.data._M_elems._24_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 6);
              local_d8.data._M_elems._32_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 8);
              local_d8.data._M_elems._40_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 10);
              local_d8.data._M_elems._48_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xc);
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xe);
              local_d8.data._M_elems._56_5_ = SUB85(uVar7,0);
              local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_d8.exp = pcVar26->exp;
              local_d8.neg = pcVar26->neg;
              local_d8.fpclass = pcVar26->fpclass;
              local_d8.prec_elem = pcVar26->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_d8,pcVar32);
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar4[iVar22].m_backend.data = local_d8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar4[iVar22].m_backend.data + 8) = local_d8.data._M_elems._8_8_
            ;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._16_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._24_8_;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x20);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._32_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._40_8_;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x30);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._48_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
            pnVar4[iVar22].m_backend.exp = local_d8.exp;
            pnVar4[iVar22].m_backend.neg = local_d8.neg;
            pnVar4[iVar22].m_backend.fpclass = local_d8.fpclass;
            pnVar4[iVar22].m_backend.prec_elem = local_d8.prec_elem;
            iVar23 = this->m_i;
            pnVar5 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = (pnVar34->m_backend).data._M_elems[0];
            uVar12 = (pnVar34->m_backend).data._M_elems[1];
            uVar13 = (pnVar34->m_backend).data._M_elems[2];
            uVar14 = (pnVar34->m_backend).data._M_elems[3];
            uVar7 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 4);
            uVar15 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 6);
            uVar16 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 8);
            uVar17 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 10);
            uVar18 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 0xe);
            puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x30);
            *(undefined8 *)puVar2 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 0xc);
            *(undefined8 *)(puVar2 + 2) = uVar18;
            puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x20);
            *(undefined8 *)puVar2 = uVar16;
            *(undefined8 *)(puVar2 + 2) = uVar17;
            puVar2 = (uint *)((long)&pnVar5[iVar23].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = uVar7;
            *(undefined8 *)(puVar2 + 2) = uVar15;
            pnVar4 = pnVar5 + iVar23;
            (pnVar4->m_backend).data._M_elems[0] = uVar11;
            *(uint *)((long)&(pnVar4->m_backend).data + 4) = uVar12;
            *(uint *)((long)&(pnVar4->m_backend).data + 8) = uVar13;
            *(uint *)((long)&(pnVar4->m_backend).data + 0xc) = uVar14;
            pnVar5[iVar23].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar5[iVar23].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar21 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar5[iVar23].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar5[iVar23].m_backend.prec_elem = iVar21;
            if ((this->m_isLhsEqualRhs).data[lVar29] == true) {
              pVVar27 = rStatus->data;
              pVVar27[iVar22] = FIXED;
            }
            else {
              if (iVar22 == this->m_maxLhsIdx) {
                pNVar8 = (this->m_scale).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)((long)(pNVar8->val).m_backend.data._M_elems + lVar24);
                local_88._72_4_ = cpp_dec_float_finite;
                local_88._76_4_ = 0x10;
                local_88._0_4_ = 0;
                local_88._4_4_ = 0;
                local_88._8_4_ = 0;
                local_88._12_4_ = 0;
                local_88._16_4_ = 0;
                local_88._20_4_ = 0;
                local_88._24_4_ = 0;
                local_88._28_4_ = 0;
                local_88._32_4_ = 0;
                local_88._36_4_ = 0;
                local_88._40_4_ = 0;
                local_88._44_4_ = 0;
                local_88._48_4_ = 0;
                local_88._52_4_ = 0;
                local_88._56_5_ = 0;
                local_88._61_3_ = 0;
                local_88._64_4_ = 0;
                local_88[0x44] = false;
                pNVar33 = pNVar6;
                if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_88 != pNVar8) &&
                   (pNVar33 = pNVar8,
                   pNVar6 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)local_88)) {
                  local_88._0_8_ = *(undefined8 *)(pNVar6->val).m_backend.data._M_elems;
                  local_88._8_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 2);
                  local_88._16_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 4);
                  local_88._24_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 6);
                  local_88._32_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 8);
                  local_88._40_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 10);
                  local_88._48_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 0xc);
                  uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 0xe);
                  local_88._56_5_ = (undefined5)uVar7;
                  local_88._61_3_ = (undefined3)((ulong)uVar7 >> 0x28);
                  local_88._64_4_ = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24);
                  local_88[0x44] =
                       *(undefined1 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24 + 4);
                  local_88._72_8_ =
                       *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24 + 8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          ((cpp_dec_float<100U,_int,_void> *)local_88,
                           (cpp_dec_float<100U,_int,_void> *)pNVar33);
                VVar28 = ON_UPPER;
                if (local_88._72_4_ != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                  cpp_dec_float<long_long>(&local_d8,0,(type *)0x0);
                  iVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)local_88,&local_d8);
                  VVar28 = (VarStatus)(0 < iVar23);
                }
              }
              else {
                pNVar8 = (this->m_scale).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)((long)(pNVar8->val).m_backend.data._M_elems + lVar24);
                local_88._72_4_ = cpp_dec_float_finite;
                local_88._76_4_ = 0x10;
                local_88._0_4_ = 0;
                local_88._4_4_ = 0;
                local_88._8_4_ = 0;
                local_88._12_4_ = 0;
                local_88._16_4_ = 0;
                local_88._20_4_ = 0;
                local_88._24_4_ = 0;
                local_88._28_4_ = 0;
                local_88._32_4_ = 0;
                local_88._36_4_ = 0;
                local_88._40_4_ = 0;
                local_88._44_4_ = 0;
                local_88._48_4_ = 0;
                local_88._52_4_ = 0;
                local_88._56_5_ = 0;
                local_88._61_3_ = 0;
                local_88._64_4_ = 0;
                local_88[0x44] = false;
                pNVar33 = pNVar6;
                if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_88 != pNVar8) &&
                   (pNVar33 = pNVar8,
                   pNVar6 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)local_88)) {
                  local_88._0_8_ = *(undefined8 *)(pNVar6->val).m_backend.data._M_elems;
                  local_88._8_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 2);
                  local_88._16_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 4);
                  local_88._24_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 6);
                  local_88._32_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 8);
                  local_88._40_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 10);
                  local_88._48_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 0xc);
                  uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 0xe);
                  local_88._56_5_ = (undefined5)uVar7;
                  local_88._61_3_ = (undefined3)((ulong)uVar7 >> 0x28);
                  local_88._64_4_ = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24);
                  local_88[0x44] =
                       *(undefined1 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24 + 4);
                  local_88._72_8_ =
                       *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24 + 8);
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          ((cpp_dec_float<100U,_int,_void> *)local_88,
                           (cpp_dec_float<100U,_int,_void> *)pNVar33);
                VVar28 = ON_LOWER;
                if (local_88._72_4_ != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                  cpp_dec_float<long_long>(&local_d8,0,(type *)0x0);
                  iVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     ((cpp_dec_float<100U,_int,_void> *)local_88,&local_d8);
                  VVar28 = (VarStatus)(iVar23 < 1);
                }
              }
              pVVar27 = rStatus->data;
              pVVar27[iVar22] = VVar28;
            }
            iVar23 = this->m_i;
            goto joined_r0x0043ea25;
          }
LAB_0043e2e8:
          if (iVar22 != iVar23) goto LAB_0043e239;
        }
        else {
          if ((VVar28 == ON_LOWER) && (iVar22 == this->m_maxLhsIdx)) {
            pcVar26 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend;
            pcVar31 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)(pNVar6->val).m_backend.data._M_elems + lVar24);
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            pcVar32 = pcVar26;
            if ((pcVar31 != &local_d8) && (pcVar32 = pcVar31, &local_d8 != pcVar26)) {
              local_d8.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems;
              local_d8.data._M_elems._8_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 2);
              local_d8.data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 4);
              local_d8.data._M_elems._24_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 6);
              local_d8.data._M_elems._32_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 8);
              local_d8.data._M_elems._40_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 10);
              local_d8.data._M_elems._48_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xc);
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xe);
              local_d8.data._M_elems._56_5_ = SUB85(uVar7,0);
              local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_d8.exp = pcVar26->exp;
              local_d8.neg = pcVar26->neg;
              local_d8.fpclass = pcVar26->fpclass;
              local_d8.prec_elem = pcVar26->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_d8,pcVar32);
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar4[iVar22].m_backend.data = local_d8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar4[iVar22].m_backend.data + 8) = local_d8.data._M_elems._8_8_
            ;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._16_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._24_8_;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x20);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._32_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._40_8_;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x30);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._48_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
            pnVar4[iVar22].m_backend.exp = local_d8.exp;
            pnVar4[iVar22].m_backend.neg = local_d8.neg;
            pnVar4[iVar22].m_backend.fpclass = local_d8.fpclass;
            pnVar4[iVar22].m_backend.prec_elem = local_d8.prec_elem;
            iVar23 = this->m_i;
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = *(undefined8 *)(pnVar34->m_backend).data._M_elems;
            uVar15 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 2);
            uVar16 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 4);
            uVar17 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 6);
            uVar18 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 8);
            uVar19 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 10);
            uVar20 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 0xe);
            puVar2 = (uint *)((long)&pnVar4[iVar23].m_backend.data + 0x30);
            *(undefined8 *)puVar2 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 0xc);
            *(undefined8 *)(puVar2 + 2) = uVar20;
            puVar2 = (uint *)((long)&pnVar4[iVar23].m_backend.data + 0x20);
            *(undefined8 *)puVar2 = uVar18;
            *(undefined8 *)(puVar2 + 2) = uVar19;
            puVar2 = (uint *)((long)&pnVar4[iVar23].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = uVar16;
            *(undefined8 *)(puVar2 + 2) = uVar17;
            *(undefined8 *)&pnVar4[iVar23].m_backend.data = uVar7;
            *(undefined8 *)((long)&pnVar4[iVar23].m_backend.data + 8) = uVar15;
            pnVar4[iVar23].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar4[iVar23].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar21 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar4[iVar23].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar4[iVar23].m_backend.prec_elem = iVar21;
            pNVar8 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)(pNVar8->val).m_backend.data._M_elems + lVar24);
            local_88._72_4_ = cpp_dec_float_finite;
            local_88._76_4_ = 0x10;
            local_88._0_4_ = 0;
            local_88._4_4_ = 0;
            local_88._8_4_ = 0;
            local_88._12_4_ = 0;
            local_88._16_4_ = 0;
            local_88._20_4_ = 0;
            local_88._24_4_ = 0;
            local_88._28_4_ = 0;
            local_88._32_4_ = 0;
            local_88._36_4_ = 0;
            local_88._40_4_ = 0;
            local_88._44_4_ = 0;
            local_88._48_4_ = 0;
            local_88._52_4_ = 0;
            local_88._56_5_ = 0;
            local_88._61_3_ = 0;
            local_88._64_4_ = 0;
            local_88[0x44] = false;
            pNVar33 = pNVar6;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_88 != pNVar8) &&
               (pNVar33 = pNVar8,
               pNVar6 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_88)) {
              local_88._0_8_ = *(undefined8 *)(pNVar6->val).m_backend.data._M_elems;
              local_88._8_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 2);
              local_88._16_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 4);
              local_88._24_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 6);
              local_88._32_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 8);
              local_88._40_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 10);
              local_88._48_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 0xc);
              uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 0xe);
              local_88._56_5_ = (undefined5)uVar7;
              local_88._61_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_88._64_4_ = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24);
              local_88[0x44] =
                   *(undefined1 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24 + 4);
              local_88._72_8_ =
                   *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)local_88,
                       (cpp_dec_float<100U,_int,_void> *)pNVar33);
            VVar28 = ON_UPPER;
            if (local_88._72_4_ != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_d8,0,(type *)0x0);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_88._80_8_;
              iVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_88,&local_d8);
              VVar28 = (VarStatus)(0 < iVar23);
            }
          }
          else {
            if ((VVar28 != ON_UPPER) || (iVar22 != this->m_minRhsIdx)) goto LAB_0043e2e8;
            pcVar26 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend;
            pcVar31 = (cpp_dec_float<100U,_int,_void> *)
                      ((long)(pNVar6->val).m_backend.data._M_elems + lVar24);
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 0x10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems[6] = 0;
            local_d8.data._M_elems[7] = 0;
            local_d8.data._M_elems[8] = 0;
            local_d8.data._M_elems[9] = 0;
            local_d8.data._M_elems[10] = 0;
            local_d8.data._M_elems[0xb] = 0;
            local_d8.data._M_elems[0xc] = 0;
            local_d8.data._M_elems[0xd] = 0;
            local_d8.data._M_elems._56_5_ = 0;
            local_d8.data._M_elems[0xf]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            pcVar32 = pcVar26;
            if ((pcVar31 != &local_d8) && (pcVar32 = pcVar31, &local_d8 != pcVar26)) {
              local_d8.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems;
              local_d8.data._M_elems._8_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 2);
              local_d8.data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 4);
              local_d8.data._M_elems._24_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 6);
              local_d8.data._M_elems._32_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 8);
              local_d8.data._M_elems._40_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 10);
              local_d8.data._M_elems._48_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xc);
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<100U,_int,_void> *)&pcVar26->data)->data)._M_elems + 0xe);
              local_d8.data._M_elems._56_5_ = SUB85(uVar7,0);
              local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_d8.exp = pcVar26->exp;
              local_d8.neg = pcVar26->neg;
              local_d8.fpclass = pcVar26->fpclass;
              local_d8.prec_elem = pcVar26->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      (&local_d8,pcVar32);
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar4[iVar22].m_backend.data = local_d8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar4[iVar22].m_backend.data + 8) = local_d8.data._M_elems._8_8_
            ;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._16_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._24_8_;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x20);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._32_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._40_8_;
            puVar2 = (uint *)((long)&pnVar4[iVar22].m_backend.data + 0x30);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._48_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
            pnVar4[iVar22].m_backend.exp = local_d8.exp;
            pnVar4[iVar22].m_backend.neg = local_d8.neg;
            pnVar4[iVar22].m_backend.fpclass = local_d8.fpclass;
            pnVar4[iVar22].m_backend.prec_elem = local_d8.prec_elem;
            iVar23 = this->m_i;
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = *(undefined8 *)(pnVar34->m_backend).data._M_elems;
            uVar15 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 2);
            uVar16 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 4);
            uVar17 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 6);
            uVar18 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 8);
            uVar19 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 10);
            uVar20 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 0xe);
            puVar2 = (uint *)((long)&pnVar4[iVar23].m_backend.data + 0x30);
            *(undefined8 *)puVar2 = *(undefined8 *)((pnVar34->m_backend).data._M_elems + 0xc);
            *(undefined8 *)(puVar2 + 2) = uVar20;
            puVar2 = (uint *)((long)&pnVar4[iVar23].m_backend.data + 0x20);
            *(undefined8 *)puVar2 = uVar18;
            *(undefined8 *)(puVar2 + 2) = uVar19;
            puVar2 = (uint *)((long)&pnVar4[iVar23].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = uVar16;
            *(undefined8 *)(puVar2 + 2) = uVar17;
            *(undefined8 *)&pnVar4[iVar23].m_backend.data = uVar7;
            *(undefined8 *)((long)&pnVar4[iVar23].m_backend.data + 8) = uVar15;
            pnVar4[iVar23].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar4[iVar23].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar21 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar4[iVar23].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar4[iVar23].m_backend.prec_elem = iVar21;
            pNVar8 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)(pNVar8->val).m_backend.data._M_elems + lVar24);
            local_88._72_4_ = cpp_dec_float_finite;
            local_88._76_4_ = 0x10;
            local_88._0_4_ = 0;
            local_88._4_4_ = 0;
            local_88._8_4_ = 0;
            local_88._12_4_ = 0;
            local_88._16_4_ = 0;
            local_88._20_4_ = 0;
            local_88._24_4_ = 0;
            local_88._28_4_ = 0;
            local_88._32_4_ = 0;
            local_88._36_4_ = 0;
            local_88._40_4_ = 0;
            local_88._44_4_ = 0;
            local_88._48_4_ = 0;
            local_88._52_4_ = 0;
            local_88._56_5_ = 0;
            local_88._61_3_ = 0;
            local_88._64_4_ = 0;
            local_88[0x44] = false;
            pNVar33 = pNVar6;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_88 != pNVar8) &&
               (pNVar33 = pNVar8,
               pNVar6 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_88)) {
              local_88._0_8_ = *(undefined8 *)(pNVar6->val).m_backend.data._M_elems;
              local_88._8_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 2);
              local_88._16_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 4);
              local_88._24_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 6);
              local_88._32_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 8);
              local_88._40_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 10);
              local_88._48_8_ = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 0xc);
              uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 0xe);
              local_88._56_5_ = (undefined5)uVar7;
              local_88._61_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_88._64_4_ = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24);
              local_88[0x44] =
                   *(undefined1 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24 + 4);
              local_88._72_8_ =
                   *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar24 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)local_88,
                       (cpp_dec_float<100U,_int,_void> *)pNVar33);
            VVar28 = ON_LOWER;
            if (local_88._72_4_ != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
              cpp_dec_float<long_long>(&local_d8,0,(type *)0x0);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_88._80_8_;
              iVar23 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_88,&local_d8);
              VVar28 = (VarStatus)(iVar23 < 1);
            }
          }
          pVVar27 = rStatus->data;
          pVVar27[iVar22] = VVar28;
          iVar23 = this->m_i;
joined_r0x0043ea25:
          bVar9 = 1;
          if (iVar22 != iVar23) {
            pVVar30 = pVVar27 + iVar23;
            bVar9 = 1;
            goto LAB_0043e2a6;
          }
        }
        lVar29 = lVar29 + 1;
        lVar24 = lVar24 + 0x54;
      } while (lVar29 < (this->m_scale).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}